

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O2

long gmlc::utilities::numeric_conversionComplete<long>(string_view V,long defValue)

{
  utilities *puVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  size_t *in_RCX;
  long lVar5;
  utilities *this;
  string_view V_00;
  string_view input;
  size_t rem;
  utilities *local_30;
  
  V_00._M_len = V._M_str;
  this = (utilities *)V._M_len;
  V_00._M_str = (char *)defValue;
  bVar2 = nonNumericFirstOrLastCharacter(this,V_00);
  lVar5 = defValue;
  if (!bVar2) {
    input._M_str = (char *)&local_30;
    input._M_len = (size_t)V_00._M_len;
    lVar4 = strViewToInteger<long>(this,input,in_RCX);
    while ((puVar1 = local_30, lVar5 = lVar4, local_30 < this &&
           (iVar3 = isspace((int)V_00._M_len[(long)local_30]), lVar5 = defValue, iVar3 != 0))) {
      local_30 = puVar1 + 1;
    }
  }
  return lVar5;
}

Assistant:

X numeric_conversionComplete(std::string_view V, const X defValue)
{
    if (nonNumericFirstOrLastCharacter(V)) {
        return defValue;
    }
    try {
        size_t rem;
        X res = numConvComp<X>(V, rem);
        while (rem < V.length()) {
            if (!(isspace(V[rem]))) {
                res = defValue;
                break;
            }
            ++rem;
        }
        return res;
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}